

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::extractClassName(string *__return_storage_ptr__,string *classOrQualifiedMethodName)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (classOrQualifiedMethodName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + classOrQualifiedMethodName->_M_string_length);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"&","");
  if (__return_storage_ptr__->_M_string_length < local_40) {
    bVar5 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)__return_storage_ptr__);
    puVar2 = local_68;
    if (local_60 == local_40) {
      if (local_60 == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_68,local_48,local_60);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (puVar2 != local_58) {
      operator_delete(puVar2);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (bVar5) {
    lVar4 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x157b0b,0xffffffffffffffff);
    std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x157b0b,lVar4 - 1);
    std::__cxx11::string::substr((ulong)&local_68,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string extractClassName( std::string const& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( startsWith( className, "&" ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }